

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O2

uint64_t __thiscall bloaty::dwarf::AttrValue::GetUint(AttrValue *this,CU *cu)

{
  uint __line;
  uint64_t uVar1;
  char *__assertion;
  
  if (this->type_ == kUint) {
    if (this->form_ != 0x21) {
      return (this->field_0).uint_;
    }
    __assertion = "form_ != DW_FORM_implicit_const";
    __line = 0x3a;
  }
  else {
    if (this->type_ == kUnresolvedUint) {
      uVar1 = ResolveIndirectAddress(this,cu);
      return uVar1;
    }
    __assertion = "type_ == Type::kUint";
    __line = 0x36;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf/attr.cc"
                ,__line,"uint64_t bloaty::dwarf::AttrValue::GetUint(const CU &) const");
}

Assistant:

uint64_t AttrValue::GetUint(const CU& cu) const {
  if (type_ == Type::kUnresolvedUint) {
    return ResolveIndirectAddress(cu);
  } else {
    assert(type_ == Type::kUint);
    // DW_FORM_implicit_const value is stored in AbbrevTable, but
    // we don't keep it in AttrValue (discarded in AbbrevTable::ReadAbbrevs()).
    // Assertion makes sure that nobody is trying to read a fake value.
    assert(form_ != DW_FORM_implicit_const);
    return uint_;
  }
}